

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choicfmt.cpp
# Opt level: O3

int32_t icu_63::ChoiceFormat::matchStringUntilLimitPart
                  (MessagePattern *pattern,int32_t partIndex,int32_t limitPartIndex,
                  UnicodeString *source,int32_t sourceOffset)

{
  ushort uVar1;
  uint16_t *puVar2;
  byte bVar3;
  int iVar4;
  Part *pPVar5;
  uint16_t *puVar6;
  char16_t *srcChars;
  int iVar7;
  int srcStart;
  int32_t iVar8;
  int length;
  long lVar9;
  
  pPVar5 = pattern->parts;
  lVar9 = (long)partIndex;
  iVar4 = (uint)pPVar5[lVar9].length + pPVar5[lVar9].index;
  iVar7 = 0;
  do {
    puVar2 = &pPVar5[lVar9 + 1].length;
    do {
      puVar6 = puVar2;
      lVar9 = lVar9 + 1;
      if (lVar9 == limitPartIndex) break;
      puVar2 = puVar6 + 8;
    } while (((Part *)(puVar6 + -4))->type != UMSGPAT_PART_TYPE_SKIP_SYNTAX);
    length = *(int *)(puVar6 + -2) - iVar4;
    if (length != 0) {
      uVar1 = (pattern->msg).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar1 & 1) == 0) {
        if ((short)uVar1 < 0) {
          iVar8 = (pattern->msg).fUnion.fFields.fLength;
        }
        else {
          iVar8 = (int)(short)uVar1 >> 5;
        }
        srcStart = iVar4;
        if (iVar8 < iVar4) {
          srcStart = iVar8;
        }
        if (iVar4 < 0) {
          srcStart = 0;
        }
        iVar4 = iVar8 - srcStart;
        if (length <= iVar8 - srcStart) {
          iVar4 = length;
        }
        if (length < 0) {
          iVar4 = 0;
        }
        srcChars = (pattern->msg).fUnion.fStackFields.fBuffer;
        if ((uVar1 & 2) == 0) {
          srcChars = (pattern->msg).fUnion.fFields.fArray;
        }
        bVar3 = icu_63::UnicodeString::doCompare(source,sourceOffset,length,srcChars,srcStart,iVar4)
        ;
      }
      else {
        bVar3 = ~*(byte *)&source->fUnion & 1;
      }
      if (bVar3 != 0) {
        return -1;
      }
    }
    iVar7 = iVar7 + length;
    if (lVar9 == limitPartIndex) {
      return iVar7;
    }
    iVar4 = (uint)*puVar6 + *(int *)(puVar6 + -2);
    pPVar5 = pattern->parts;
  } while( true );
}

Assistant:

int32_t
ChoiceFormat::matchStringUntilLimitPart(
        const MessagePattern &pattern, int32_t partIndex, int32_t limitPartIndex,
        const UnicodeString &source, int32_t sourceOffset) {
    int32_t matchingSourceLength = 0;
    const UnicodeString &msgString = pattern.getPatternString();
    int32_t prevIndex = pattern.getPart(partIndex).getLimit();
    for (;;) {
        const MessagePattern::Part &part = pattern.getPart(++partIndex);
        if (partIndex == limitPartIndex || part.getType() == UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
            int32_t index = part.getIndex();
            int32_t length = index - prevIndex;
            if (length != 0 && 0 != source.compare(sourceOffset, length, msgString, prevIndex, length)) {
                return -1;  // mismatch
            }
            matchingSourceLength += length;
            if (partIndex == limitPartIndex) {
                return matchingSourceLength;
            }
            prevIndex = part.getLimit();  // SKIP_SYNTAX
        }
    }
}